

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::
error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
::
error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>
          (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
           *this,undefined8 param_2,maybe<unsigned_char,_void> *param_3)

{
  maybe<unsigned_char,_void> *this_00;
  
  this[0x10] = (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
                )0x0;
  this_00 = (maybe<unsigned_char,_void> *)
            value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::maybe<unsigned_char,void>>>
                      ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::maybe<unsigned_char,_void>_>_>
                        *)this);
  maybe<unsigned_char,_void>::maybe(this_00,param_3);
  *(undefined8 *)(this_00 + 4) = param_2;
  return;
}

Assistant:

explicit error_or (in_place_t const inp, Args &&... args)
                : has_error_{false} {
            (void) inp;
            new (get_storage ()) storage_type (std::forward<Args> (args)...);
        }